

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinFdBeginTransitionA::emulate_mthd(MthdKelvinFdBeginTransitionA *this)

{
  int local_18;
  uint local_14;
  int i;
  int ctr;
  MthdKelvinFdBeginTransitionA *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d <<
               0x3c) < 0) &&
       (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                           debug_fd_check_skip << 0x37))) {
      if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                             fe3d_misc << 0x3b)) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x33) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x30) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                             fe3d_misc << 0x2f)) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x27) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
    }
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xfeffffff;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xffffefff |
           0x1000;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_shadow_begin_transition_a
           = (this->super_SingleMthdTest).super_MthdTest.val;
      local_14 = 0;
      for (local_18 = 1; local_18 < 8; local_18 = local_18 + 1) {
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
            (0x3cU - (char)(local_18 << 2) & 0x3f)) >> 0x3c != 0) {
          local_14 = local_14 + 1;
        }
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_state_transition =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_state_transition &
           0xf0ffffff | (local_14 & 0xf) << 0x18;
      pgraph_fd_cmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x2800,
                    (this->super_SingleMthdTest).super_MthdTest.val);
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xfeffffff |
           0x1000000;
    }
  }
  else {
    nv04_pgraph_missing_hw(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type != 0x20) {
			nv04_pgraph_missing_hw(&exp);
			return;
		}
		if (extr(exp.debug_d, 3, 1) && !extr(exp.debug_fd_check_skip, 8, 1)) {
			if (!extr(exp.fe3d_misc, 4, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 12, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 15, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (!extr(exp.fe3d_misc, 16, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 24, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
		}
		if (!exp.nsource) {
			insrt(exp.fe3d_misc, 24, 1, 0);
			insrt(exp.fe3d_misc, 12, 1, 1);
			exp.fe3d_shadow_begin_transition_a = val;
			int ctr = 0;
			for (int i = 1; i < 8; i++)
				if (extr(val, i * 4, 4))
					ctr++;
			insrt(exp.fe3d_state_transition, 24, 4, ctr);
			pgraph_fd_cmd(&exp, 0x2800, val);
		} else {
			insrt(exp.fe3d_misc, 24, 1, 1);
		}
	}